

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing>::moveAppend
          (QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *this,Changing *b,Changing *e
          )

{
  Changing *this_00;
  ulong in_RDX;
  ulong in_RSI;
  Changing *in_RDI;
  Changing *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing>::begin
                        ((QArrayDataPointer<QAbstractItemModelTesterPrivate::Changing> *)0x1abce7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QAbstractItemModelTesterPrivate::Changing::Changing(this_00,in_RDI);
      local_10 = local_10 + 0x60;
      (in_RDI->parent).m.ptr = (in_RDI->parent).m.ptr + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }